

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpls.cpp
# Opt level: O1

int adios2::utils::readVarBlock<unsigned_char>
              (Engine *fp,IO *io,Variable<unsigned_char> *variable,size_t step,size_t blockid,
              Dims *Count,Dims *Start)

{
  pointer puVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  int iVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint64_t uVar9;
  size_type __new_size;
  long lVar10;
  bool bVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  uint tdims;
  vector<unsigned_char,_std::allocator<unsigned_char>_> dataV;
  Dims startv;
  Dims countv;
  uint64_t c [16];
  uint64_t s [16];
  uint64_t readn [16];
  uint64_t count_t [16];
  uint64_t start_t [16];
  int ndigits_dims [32];
  ulong local_420;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_3e8;
  long local_3d0;
  long local_3c8;
  Engine *local_3c0;
  ulong local_3b8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_3b0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_398;
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_380;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_350;
  uint64_t local_338 [15];
  ulong auStack_2c0 [16];
  ulong uStack_240;
  uint64_t auStack_238 [15];
  ulong uStack_1c0;
  ulong local_1b8 [15];
  ulong uStack_140;
  ulong local_138 [16];
  int local_b8 [34];
  
  local_3e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar7 = *(ulong *)(variable + 0x30);
  local_3b8 = 1;
  local_3c0 = fp;
  if (timestep == '\0') {
    local_3b8 = adios2::core::VariableBase::GetAvailableStepsCount();
  }
  lVar5 = *(long *)(variable + 0x90);
  lVar10 = *(long *)(variable + 0x88);
  if ((int)(uint)local_3b8 < 2) {
    iVar4 = 0;
  }
  else {
    uVar14 = (ulong)((uint)(istart >> 0x3f) & (uint)local_3b8) + istart;
    lVar12 = (((local_3b8 & 0xffffffff) + icount) - uVar14) + 1;
    if (-1 < icount) {
      lVar12 = icount;
    }
    if (2 < verbose) {
      printf("    time: st=%lu ct=%lu\n",uVar14,lVar12);
    }
    if ((step < uVar14) || (iVar4 = 1, lVar12 + uVar14 <= step)) goto LAB_0013a9cc;
  }
  tdims = (uint)((ulong)(lVar5 - lVar10) >> 3);
  if ((int)tdims < 1) {
    bVar11 = true;
    local_420 = 1;
  }
  else {
    local_420 = 1;
    uVar14 = 0;
    bVar11 = false;
    do {
      lVar5 = uVar14 * 8 + (ulong)(uint)(iVar4 << 3);
      uVar16 = *(ulong *)((long)&istart + lVar5);
      if ((long)uVar16 < 0) {
        uVar16 = uVar16 + (Count->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                          ._M_impl.super__Vector_impl_data._M_start[uVar14];
      }
      uVar6 = *(ulong *)((long)&icount + lVar5);
      if ((long)uVar6 < 0) {
        uVar6 = (uVar6 - uVar16) +
                (Count->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar14] + 1;
      }
      uVar8 = (Count->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar14];
      if (uVar8 < uVar16) {
        bVar11 = true;
      }
      uVar15 = uVar8 - uVar16;
      if (uVar6 < uVar8 - uVar16) {
        uVar15 = uVar6;
      }
      if (uVar8 < uVar16) {
        uVar15 = uVar6;
      }
      if (2 < verbose) {
        printf("    j=%d, st=%lu ct=%lu\n",uVar14 & 0xffffffff,uVar16,uVar15);
      }
      (&uStack_140)[uVar14 + 1] = uVar16;
      (&uStack_1c0)[uVar14 + 1] = uVar15;
      local_420 = local_420 * uVar15;
      if (1 < verbose) {
        printf("    s[%d]=%lu, c[%d]=%lu, n=%lu\n",uVar14 & 0xffffffff,uVar16,uVar14 & 0xffffffff,
               uVar15,local_420);
      }
      uVar14 = uVar14 + 1;
    } while ((tdims & 0x7fffffff) != uVar14);
    bVar11 = !bVar11;
  }
  if (1 < verbose) {
    printf(" total size of data to read = %lu\n",local_420 * uVar7);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_350,Count);
  print_slice_info((VariableBase *)variable,false,local_138,local_1b8,&local_350);
  if (local_350.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_350.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (bVar11) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar7;
    uVar7 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xa00000)) / auVar3,0);
    if (local_420 < uVar7) {
      uVar7 = local_420;
    }
    if (1 < verbose) {
      puts("Read size strategy:");
    }
    uVar13 = tdims - 1;
    if ((int)tdims < 1) {
      uVar14 = 1;
      lVar5 = 1;
    }
    else {
      lVar5 = 1;
      uVar14 = 1;
      uVar16 = (ulong)uVar13;
      do {
        if (uVar14 < uVar7) {
          uVar8 = uVar7 / (uVar14 & 0xffffffff);
          uVar6 = (&uStack_1c0)[uVar16 + 1];
          if (uVar8 < (&uStack_1c0)[uVar16 + 1]) {
            uVar6 = uVar8;
          }
          (&uStack_240)[uVar16 + 1] = uVar6;
        }
        else {
          (&uStack_240)[uVar16 + 1] = 1;
        }
        if (1 < verbose) {
          printf("    dim %d: read %lu elements\n",uVar16 & 0xffffffff,(&uStack_240)[uVar16 + 1]);
        }
        uVar14 = uVar14 * (&uStack_1c0)[uVar16 + 1];
        lVar5 = lVar5 * (&uStack_240)[uVar16 + 1];
        bVar11 = 0 < (long)uVar16;
        uVar16 = uVar16 - 1;
      } while (bVar11);
    }
    if (1 < verbose) {
      printf("    read %lu elements at once, %lu in total (nelems=%lu)\n",lVar5,uVar14,local_420);
    }
    if (0 < (int)tdims) {
      uVar7 = 0;
      do {
        uVar14 = (&uStack_140)[uVar7 + 1];
        auStack_2c0[uVar7 + 1] = uVar14;
        local_338[uVar7] = (&uStack_240)[uVar7 + 1];
        iVar4 = snprintf(ndigits(unsigned_long)::digitstr,0x20,"%zu",
                         (uVar14 - 1) + (&uStack_1c0)[uVar7 + 1]);
        local_b8[uVar7] = iVar4;
        uVar7 = uVar7 + 1;
      } while ((tdims & 0x7fffffff) != uVar7);
    }
    if (local_420 != 0) {
      local_3c8 = (long)(int)uVar13;
      uVar14 = (ulong)(tdims & 0x7fffffff);
      local_3d0 = (ulong)(tdims - 2) + 1;
      uVar7 = 0;
      do {
        if ((int)tdims < 1) {
          lVar5 = 1;
        }
        else {
          lVar5 = 1;
          uVar16 = 0;
          do {
            lVar5 = lVar5 * local_338[uVar16];
            uVar16 = uVar16 + 1;
          } while (uVar14 != uVar16);
        }
        uVar16 = auStack_2c0[local_3c8 + 1];
        uVar6 = uVar7;
        if (1 < (int)tdims) {
          uVar9 = local_338[local_3c8];
          lVar10 = local_3d0;
          do {
            uVar6 = auStack_2c0[lVar10] * uVar9;
            uVar16 = uVar16 + uVar6;
            uVar9 = uVar9 * local_338[lVar10 + -1];
            lVar12 = lVar10 + -1;
            bVar11 = 0 < lVar10;
            lVar10 = lVar12;
          } while (lVar12 != 0 && bVar11);
        }
        if (2 < verbose) {
          printf("adios_read_var name=%s ",*(undefined8 *)(variable + 8),uVar6);
          printf("%s = { ","  start");
          if (0 < (int)tdims) {
            uVar6 = 0;
            do {
              printf("%lu ",auStack_2c0[uVar6 + 1]);
              uVar6 = uVar6 + 1;
            } while (uVar14 != uVar6);
          }
          putchar(0x7d);
          printf("%s = { ","  count");
          if (0 < (int)tdims) {
            uVar6 = 0;
            do {
              printf("%lu ",local_338[uVar6]);
              uVar6 = uVar6 + 1;
            } while (uVar14 != uVar6);
          }
          putchar(0x7d);
          printf("  read %lu elems\n",lVar5);
        }
        if (1 < verbose) {
          printf("    read block %zu from offset %lu nelems %lu)\n",blockid,uVar16,lVar5);
        }
        adios2::helper::Uint64ArrayToSizetVector((ulong)&local_3b0,(ulong *)(long)(int)tdims);
        adios2::helper::Uint64ArrayToSizetVector((ulong)&local_398,(ulong *)(long)(int)tdims);
        if ((*(int *)(variable + 0x40) == 2) && (0 < (int)tdims)) {
          puVar1 = (Start->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          uVar16 = 0;
          do {
            local_3b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[uVar16] =
                 local_3b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start[uVar16] + puVar1[uVar16];
            uVar16 = uVar16 + 1;
          } while (uVar14 != uVar16);
        }
        if (2 < verbose) {
          printf("set selection: ");
          printf("%s = { ","  start");
          if (0 < (int)tdims) {
            uVar16 = 0;
            do {
              printf("%zu ",local_3b0.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar16]);
              uVar16 = uVar16 + 1;
            } while (uVar14 != uVar16);
          }
          putchar(0x7d);
          printf("%s = { ","  count");
          if (0 < (int)tdims) {
            uVar16 = 0;
            do {
              printf("%zu ",local_398.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar16]);
              uVar16 = uVar16 + 1;
            } while (uVar14 != uVar16);
          }
          putchar(0x7d);
          putchar(10);
        }
        if (variable[0x54] == (Variable<unsigned_char>)0x0) {
          if (*(int *)(variable + 0x40) == 5) {
            adios2::core::VariableBase::SetBlockSelection((ulong)variable);
          }
          std::
          pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::
          pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&,_true>
                    (&local_380,&local_3b0,&local_398);
          adios2::core::VariableBase::SetSelection((pair *)variable);
          if (local_380.second.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_380.second.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_380.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_380.first.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
        }
        if (1 < (int)local_3b8) {
          if (2 < verbose) {
            printf("set Step selection: from %lu read %lu steps\n",auStack_2c0[1],local_338[0]);
          }
          local_380.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x1;
          local_380.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)step;
          adios2::core::VariableBase::SetStepSelection((pair *)variable);
        }
        __new_size = adios2::core::Variable<unsigned_char>::SelectionSize();
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_3e8,__new_size);
        adios2::core::Engine::Get<unsigned_char>((Variable *)local_3c0,variable,(Mode)&local_3e8);
        print_dataset(local_3e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,*(DataType *)(variable + 0x28),
                      auStack_2c0 + 1,local_338,tdims,local_b8);
        if (0 < (int)tdims) {
          bVar11 = true;
          lVar10 = (ulong)uVar13 + 1;
          do {
            if (bVar11) {
              uVar9 = local_338[lVar10 + -1];
              uVar16 = (&uStack_1c0)[lVar10] + (&uStack_140)[lVar10];
              if (uVar9 + auStack_2c0[lVar10] == uVar16) {
                auStack_2c0[lVar10] = (&uStack_140)[lVar10];
                uVar9 = (&uStack_240)[lVar10];
                bVar11 = true;
              }
              else {
                uVar6 = auStack_2c0[lVar10] + (&uStack_240)[lVar10];
                auStack_2c0[lVar10] = uVar6;
                if (uVar9 + uVar6 <= uVar16) {
                  bVar11 = false;
                  goto LAB_0013a967;
                }
                uVar9 = uVar16 - uVar6;
                bVar11 = false;
              }
              local_338[lVar10 + -1] = uVar9;
            }
LAB_0013a967:
            lVar12 = lVar10 + -1;
            bVar2 = 0 < lVar10;
            lVar10 = lVar12;
          } while (lVar12 != 0 && bVar2);
        }
        if (local_398.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_398.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_3b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_3b0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        uVar7 = uVar7 + lVar5;
      } while (uVar7 < local_420);
    }
    if (nextcol != 0) {
      fputc(10,outf);
    }
    nextcol = 0;
  }
LAB_0013a9cc:
  if (local_3e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int readVarBlock(core::Engine *fp, core::IO *io, core::Variable<T> *variable, size_t step,
                 size_t blockid, Dims Count, Dims Start)
{
    int i, j;
    uint64_t start_t[MAX_DIMS],
        count_t[MAX_DIMS]; // processed <0 values in start/count
    uint64_t s[MAX_DIMS],
        c[MAX_DIMS]; // for block reading of smaller chunks
    uint64_t nelems; // number of elements to read
    int tidx;
    uint64_t st, ct;
    std::vector<T> dataV;
    uint64_t sum;             // working var to sum up things
    uint64_t maxreadn;        // max number of elements to read once up to a limit
                              // (10MB of data)
    uint64_t actualreadn;     // our decision how much to read at once
    uint64_t readn[MAX_DIMS]; // how big chunk to read in in each dimension?
    bool incdim;              // used in incremental reading in
    int ndigits_dims[32];     // # of digits (to print) of each dimension

    const size_t elemsize = variable->m_ElementSize;
    const int nsteps = (timestep ? 1 : static_cast<int>(variable->GetAvailableStepsCount()));
    const int ndim = static_cast<int>(variable->m_Count.size());
    // create the counter arrays with the appropriate lengths
    // transfer start and count arrays to format dependent arrays

    nelems = 1;
    tidx = 0;

    if (nsteps > 1)
    {
        if (istart[0] < 0) // negative index means last-|index|
            st = nsteps + istart[0];
        else
            st = istart[0];
        if (icount[0] < 0) // negative index means last-|index|+1-start
            ct = nsteps + icount[0] + 1 - st;
        else
            ct = icount[0];

        if (verbose > 2)
            printf("    time: st=%" PRIu64 " ct=%" PRIu64 "\n", st, ct);

        // check if this block falls into the requested time
        if (step < st || step >= st + ct)
            return 0;
        tidx = 1;
    }

    int out_of_bound = 0;
    for (j = 0; j < ndim; j++)
    {
        if (istart[j + tidx] < 0) // negative index means last-|index|
            st = Count[j] + istart[j + tidx];
        else
            st = istart[j + tidx];
        if (icount[j + tidx] < 0) // negative index means last-|index|+1-start
            ct = Count[j] + icount[j + tidx] + 1 - st;
        else
            ct = icount[j + tidx];

        if (st > Count[j])
        {
            out_of_bound = 1;
        }
        else if (ct > Count[j] - st)
        {
            ct = Count[j] - st;
        }
        if (verbose > 2)
            printf("    j=%d, st=%" PRIu64 " ct=%" PRIu64 "\n", j, st, ct);

        start_t[j] = st;
        count_t[j] = ct;
        nelems *= ct;
        if (verbose > 1)
            printf("    s[%d]=%" PRIu64 ", c[%d]=%" PRIu64 ", n=%" PRIu64 "\n", j, start_t[j], j,
                   count_t[j], nelems);
    }

    if (verbose > 1)
    {
        printf(" total size of data to read = %" PRIu64 "\n", nelems * elemsize);
    }

    print_slice_info(variable, false, start_t, count_t, Count);

    if (out_of_bound)
        return 0;

    maxreadn = MAX_BUFFERSIZE / elemsize;
    if (nelems < maxreadn)
        maxreadn = nelems;

    // allocate data array
    // data = (void *)malloc(maxreadn * elemsize + 8); // +8 for just to be
    // sure

    // determine strategy how to read in:
    //  - at once
    //  - loop over 1st dimension
    //  - loop over 1st & 2nd dimension
    //  - etc
    if (verbose > 1)
        printf("Read size strategy:\n");
    sum = (uint64_t)1;
    actualreadn = (uint64_t)1;
    for (i = ndim - 1; i >= 0; i--)
    {
        if (sum >= (uint64_t)maxreadn)
        {
            readn[i] = 1;
        }
        else
        {
            readn[i] = maxreadn / (int)sum; // sum is small for 4 bytes here
            // this may be over the max count for this dimension
            if (readn[i] > count_t[i])
                readn[i] = count_t[i];
        }
        if (verbose > 1)
            printf("    dim %d: read %" PRIu64 " elements\n", i, readn[i]);
        sum = sum * (uint64_t)count_t[i];
        actualreadn = actualreadn * readn[i];
    }
    if (verbose > 1)
        printf("    read %" PRIu64 " elements at once, %" PRIu64 " in total (nelems=%" PRIu64 ")\n",
               actualreadn, sum, nelems);

    // init s and c
    // and calculate ndigits_dims
    for (j = 0; j < ndim; j++)
    {
        s[j] = start_t[j];
        c[j] = readn[j];

        ndigits_dims[j] =
            ndigits(start_t[j] + count_t[j] - 1); // -1: dim=100 results in 2 digits (0..99)
    }

    // read until read all 'nelems' elements
    sum = 0;
    while (sum < nelems)
    {

        // how many elements do we read in next?
        actualreadn = 1;
        for (j = 0; j < ndim; j++)
            actualreadn *= c[j];

        uint64_t startoffset = s[ndim - 1];
        uint64_t tmpprod = c[ndim - 1];
        for (i = ndim - 2; i >= 0; i--)
        {
            startoffset += s[i] * tmpprod;
            tmpprod *= c[i];
        }

        if (verbose > 2)
        {
            printf("adios_read_var name=%s ", variable->m_Name.c_str());
            PRINT_DIMS_UINT64("  start", s, ndim, j);
            PRINT_DIMS_UINT64("  count", c, ndim, j);
            printf("  read %" PRIu64 " elems\n", actualreadn);
        }
        if (verbose > 1)
            printf("    read block %zu from offset %" PRIu64 " nelems %" PRIu64 ")\n", blockid,
                   startoffset, actualreadn);

        // read a slice finally
        Dims startv = helper::Uint64ArrayToSizetVector(ndim, s);
        Dims countv = helper::Uint64ArrayToSizetVector(ndim, c);

        /* In current implementation we read with global selection, so
         * we need to adjust start_t for global offsets here.
         * TODO: this will change in the future to block reading with
         * relative
         * selection
         */
        if (variable->m_ShapeID == ShapeID::GlobalArray)
        {
            for (j = 0; j < ndim; j++)
            {
                startv[j] += Start[j];
            }
        }

        if (verbose > 2)
        {
            printf("set selection: ");
            PRINT_DIMS_SIZET("  start", startv.data(), ndim, j);
            PRINT_DIMS_SIZET("  count", countv.data(), ndim, j);
            printf("\n");
        }

        if (!variable->m_SingleValue)
        {
            if (variable->m_ShapeID == ShapeID::LocalArray)
            {
                variable->SetBlockSelection(blockid);
            }
            variable->SetSelection({startv, countv});
        }

        if (nsteps > 1)
        {
            if (verbose > 2)
            {
                printf("set Step selection: from %" PRIu64 " read %" PRIu64 " steps\n", s[0], c[0]);
            }
            variable->SetStepSelection({step, 1});
        }

        dataV.resize(variable->SelectionSize());
        fp->Get(*variable, dataV, adios2::Mode::Sync);
        // print slice
        print_dataset(dataV.data(), variable->m_Type, s, c, ndim, ndigits_dims);

        // prepare for next read
        sum += actualreadn;
        incdim = true; // largest dim should be increased
        for (j = ndim - 1; j >= 0; j--)
        {
            if (incdim)
            {
                if (s[j] + c[j] == start_t[j] + count_t[j])
                {
                    // reached the end of this dimension
                    s[j] = start_t[j];
                    c[j] = readn[j];
                    incdim = true; // next smaller dim can increase too
                }
                else
                {
                    // move up in this dimension up to total count
                    s[j] += readn[j];
                    if (s[j] + c[j] > start_t[j] + count_t[j])
                    {
                        // do not reach over the limit
                        c[j] = start_t[j] + count_t[j] - s[j];
                    }
                    incdim = false;
                }
            }
        }
    } // end while sum < nelems
    print_endline();
    return 0;
}